

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall RoomBase::handle(RoomBase *this,Event *event)

{
  pointer pPVar1;
  pointer pQVar2;
  undefined8 uVar3;
  __type _Var4;
  PlayerInfo *player;
  long lVar5;
  ulong uVar6;
  __normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_> __first;
  pointer pPVar7;
  ulong uVar8;
  PlayerInfo *player_1;
  pointer pPVar9;
  uint uVar10;
  int8_t *piVar11;
  iterator __begin4;
  iterator __end4;
  ulong uVar12;
  pointer __args;
  float fVar13;
  TTimestamp TVar14;
  _Any_data local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  code *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68 [3];
  
  uVar3 = local_88._8_8_;
  local_88._M_unused._M_object = this;
  switch(event->type) {
  case StartNewRound:
    if (event->roomId != this->id) {
      return;
    }
    this->roundId = this->roundId + 1;
    std::vector<Query,_std::allocator<Query>_>::clear(&this->pool);
    std::vector<Query,_std::allocator<Query>_>::clear(&this->poolOld);
    while (lVar5 = (long)(this->pool).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->pool).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                         super__Vector_impl_data._M_start,
          (ulong)(lVar5 / 0x58) < (ulong)(long)this->poolSize) {
      (**this->_vptr_RoomBase)(&local_88,this);
      std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                (&this->pool,(Query *)&local_88);
      Query::~Query((Query *)&local_88);
    }
    __first = std::
              __remove_if<__gnu_cxx::__normal_iterator<PlayerInfo*,std::vector<PlayerInfo,std::allocator<PlayerInfo>>>,__gnu_cxx::__ops::_Iter_pred<RoomBase::handle(Event&&)::_lambda(auto:1_const&)_1_>>
                        ((this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish,lVar5 % 0x58);
    std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::erase
              (&this->players,(const_iterator)__first._M_current,
               (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
               super__Vector_impl_data._M_finish);
    pPVar1 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pPVar7 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start; pPVar7 != pPVar1; pPVar7 = pPVar7 + 1) {
      pPVar7->score = 0.0;
      pPVar7->active = '\x01';
    }
    TVar14 = anon_unknown.dwarf_11b02::timestamp_s();
    this->tRoundStart_s = TVar14;
    if (this->mode == BattleRoyale) {
      this->tRoundLength_s = this->tBRRoundLength_s;
    }
    local_88._8_8_ = 0;
    local_70 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:205:37)>
               ::_M_invoke;
    local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:205:37)>
                  ::_M_manager;
    Notifier::notify(&this->notifier,(function<void_()> *)&local_88);
    break;
  case CheckStart:
    if (event->roomId != this->id) {
      return;
    }
    if (this->mode == BattleRoyale) {
      uVar10 = 0;
      for (pPVar7 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pPVar7 != (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pPVar7 = pPVar7 + 1) {
        uVar10 = (uVar10 + 1) - (uint)(pPVar7->active == '\0');
      }
      TVar14 = anon_unknown.dwarf_11b02::timestamp_s();
      this->tNextRoundStart_s =
           (((double)CONCAT44(0x45300000,(int)(this->tTimeBetweenRounds_ms >> 0x20)) -
            1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)this->tTimeBetweenRounds_ms) - 4503599627370496.0)) *
           0.001 + TVar14;
      if (uVar10 < 2) {
        local_88._8_8_ = 0;
        local_70 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:260:53)>
                   ::_M_invoke;
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:260:53)>
                      ::_M_manager;
        Notifier::notify(&this->notifier,(function<void_()> *)&local_88);
      }
      else {
        local_88._8_8_ = 0;
        local_70 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:248:53)>
                   ::_M_invoke;
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:248:53)>
                      ::_M_manager;
        Notifier::notify(&this->notifier,(function<void_()> *)&local_88);
      }
    }
    else {
      if (this->mode != Standard) {
        return;
      }
      TVar14 = anon_unknown.dwarf_11b02::timestamp_s();
      this->tNextRoundStart_s =
           (((double)CONCAT44(0x45300000,(int)(this->tTimeBetweenRounds_ms >> 0x20)) -
            1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)this->tTimeBetweenRounds_ms) - 4503599627370496.0)) *
           0.001 + TVar14;
      local_88._8_8_ = 0;
      local_70 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:225:49)>
                 ::_M_invoke;
      local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:225:49)>
                    ::_M_manager;
      Notifier::notify(&this->notifier,(function<void_()> *)&local_88);
    }
    break;
  case EndRound:
    local_88._4_4_ = event->roomId;
    if (local_88._4_4_ != this->id) {
      return;
    }
    if (this->mode == BattleRoyale) {
      uVar10 = 0;
      printf("Room %d: ending BR round %d\n",(ulong)(uint)local_88._4_4_,(ulong)(uint)this->roundId)
      ;
      pPVar1 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pPVar7 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (pPVar9 = pPVar7; pPVar9 != pPVar1; pPVar9 = pPVar9 + 1) {
        uVar10 = uVar10 + (pPVar9->active == '\x01');
      }
      if (2 < uVar10) {
        uVar6 = ((long)pPVar1 - (long)pPVar7) / 0xc;
        uVar12 = 0;
        uVar8 = uVar6 & 0xffffffff;
        if ((int)uVar6 < 1) {
          uVar8 = uVar12;
        }
        piVar11 = &pPVar7->active;
        uVar6 = 0xffffffffffffffff;
        fVar13 = 1e+06;
        for (; uVar8 != uVar12; uVar12 = uVar12 + 1) {
          if ((*(float *)(piVar11 + -4) < fVar13) && (*piVar11 == '\x01')) {
            uVar6 = uVar12 & 0xffffffff;
            fVar13 = *(float *)(piVar11 + -4);
          }
          piVar11 = piVar11 + 0xc;
        }
        pPVar7[(int)uVar6].active = '\x02';
        this->tRoundLength_s = this->tBRRoundLength_s + this->tRoundLength_s;
        local_88._8_8_ = 0;
        local_70 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:324:53)>
                   ::_M_invoke;
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:324:53)>
                      ::_M_manager;
        Notifier::notify(&this->notifier,(function<void_()> *)&local_88);
        break;
      }
      printf("Room %d: ending round\n",(ulong)(uint)this->id);
      local_88._8_4_ = 0xffffffff;
      local_78 = local_68;
      local_70 = (code *)0x0;
      local_68[0]._M_local_buf[0] = '\0';
      local_88._4_4_ = this->id;
      local_88._0_4_ = 2;
      Events::push((this->notifier).events,(Event *)&local_88);
    }
    else {
      if (this->mode != Standard) {
        return;
      }
      local_88._8_4_ = 0xffffffff;
      local_78 = local_68;
      local_70 = (code *)0x0;
      local_68[0]._M_local_buf[0] = '\0';
      local_88._0_4_ = 2;
      Events::push((this->notifier).events,(Event *)&local_88);
    }
    std::__cxx11::string::~string((string *)&local_78);
    return;
  case PlayerJoinRoom:
    pPVar7 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar1 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (event->roomId != this->id) {
      for (; pPVar7 != pPVar1; pPVar7 = pPVar7 + 1) {
        if (pPVar7->clientId == event->clientId) {
          pPVar7->active = '\0';
          printf("Client (%d) left room \'%s\' (%d)\n",(ulong)(uint)pPVar7->clientId,
                 (this->name)._M_dataplus._M_p,(ulong)(uint)this->id);
        }
      }
      return;
    }
    for (; pPVar7 != pPVar1; pPVar7 = pPVar7 + 1) {
      if (pPVar7->clientId == event->clientId) {
        pPVar7->active = '\x01';
        return;
      }
    }
    local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
    if (this->mode == Standard) {
      local_88._M_pod_data[8] = 1;
    }
    else {
      if (this->mode != BattleRoyale) goto LAB_00108008;
      local_88._M_pod_data[8] = 2;
    }
    local_88._9_7_ = SUB87(uVar3,1);
LAB_00108008:
    local_88._4_4_ = 0;
    local_88._0_4_ = event->clientId;
    std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::emplace_back<PlayerInfo>
              (&this->players,(PlayerInfo *)&local_88);
    printf("Client (%d) joined room \'%s\' (%d)\n",(ulong)(uint)event->clientId,
           (this->name)._M_dataplus._M_p,(ulong)(uint)this->id);
    return;
  case PlayerInput:
    if (event->roomId != this->id) {
      return;
    }
    TVar14 = anon_unknown.dwarf_11b02::timestamp_s();
    if (this->tRoundStart_s + this->tRoundLength_s < TVar14) {
      return;
    }
    pPVar7 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pPVar7) / 0xc;
    uVar12 = 0;
    uVar8 = uVar6 & 0xffffffff;
    if ((int)uVar6 < 1) {
      uVar8 = uVar12;
    }
    while( true ) {
      if (uVar8 * 0xc - uVar12 == 0) {
        return;
      }
      if (*(uint *)((long)&pPVar7->clientId + uVar12) == event->clientId) break;
      uVar12 = uVar12 + 0xc;
    }
    if ((&pPVar7->active)[uVar12] != '\x01') {
      return;
    }
    printf("Room %d: client %d submitted \'%s\'\n",(ulong)(uint)this->id,
           (ulong)(uint)event->clientId,(event->inputStr)._M_dataplus._M_p);
    pPVar7 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    __args = (this->pool).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
             super__Vector_impl_data._M_start;
    pQVar2 = (this->pool).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while( true ) {
      if (__args == pQVar2) {
        puts("wrong!");
        fVar13 = *(float *)((long)&pPVar7->score + uVar12) + -1.0;
        *(float *)((long)&pPVar7->score + uVar12) = fVar13;
        if (0.0 <= fVar13) {
          return;
        }
        *(undefined4 *)((long)&pPVar7->score + uVar12) = 0;
        return;
      }
      _Var4 = std::operator==(&event->inputStr,&__args->answer);
      if (_Var4) break;
      __args = __args + 1;
    }
    *(float *)((long)&pPVar7->score + uVar12) =
         (float)(__args->answer)._M_string_length * 0.2 + 3.0 +
         *(float *)((long)&pPVar7->score + uVar12);
    __args->clientId = event->clientId;
    TVar14 = anon_unknown.dwarf_11b02::timestamp_s();
    __args->tGuessed_s = TVar14;
    std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>(&this->poolOld,__args);
    (**this->_vptr_RoomBase)(&local_88,this);
    Query::operator=(__args,(Query *)&local_88);
    Query::~Query((Query *)&local_88);
    puts("correct!");
    return;
  default:
    printf("Unhandled event, type = %d\n");
    return;
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  return;
}

Assistant:

virtual void handle(Event && event) {
        switch (event.type) {
            case Event::StartNewRound:
                {
                    if (event.roomId != id) return;

                    ++roundId;
                    //printf("Room %d: starting new round %d\n", id, roundId);

                    pool.clear();
                    poolOld.clear();
                    while (pool.size() < poolSize) {
                        pool.emplace_back(generate());
                    }

                    players.erase(std::remove_if(players.begin(), players.end(),
                                                 [](const auto & p) { return p.active == 0; }),
                                  players.end());

                    for (auto & player : players) {
                        player.score = 0.0f;
                        player.active = 1;
                    }

                    tRoundStart_s = timestamp_s();

                    switch (mode) {
                        case Standard:
                            {
                            }
                            break;
                        case BattleRoyale:
                            {
                                tRoundLength_s = tBRRoundLength_s;
                            }
                            break;
                    };

                    notifier.notify([&]() {
                        std::this_thread::sleep_for(std::chrono::milliseconds((uint64_t)(1000.0*tRoundLength_s)));

                        Event event;
                        event.roomId = id;
                        event.type = Event::EndRound;

                        notifier.events->push(std::move(event));
                    });
                }
                break;
            case Event::CheckStart:
                {
                    if (event.roomId != id) return;

                    switch (mode) {
                        case Standard:
                            {
                                tNextRoundStart_s = timestamp_s() + 0.001*tTimeBetweenRounds_ms;

                                notifier.notify([&]() {
                                    std::this_thread::sleep_for(std::chrono::milliseconds(tTimeBetweenRounds_ms));

                                    Event event;
                                    event.roomId = id;
                                    event.type = Event::StartNewRound;

                                    notifier.events->push(std::move(event));
                                });
                            }
                            break;
                        case BattleRoyale:
                            {
                                int nActive = 0;
                                for (auto & player : players) {
                                    if (player.active != 0) {
                                        ++nActive;
                                    }
                                }

                                if (nActive > 1) {
                                    tNextRoundStart_s = timestamp_s() + 0.001*tTimeBetweenRounds_ms;

                                    notifier.notify([&]() {
                                        std::this_thread::sleep_for(std::chrono::milliseconds(tTimeBetweenRounds_ms));

                                        Event event;
                                        event.roomId = id;
                                        event.type = Event::StartNewRound;

                                        notifier.events->push(std::move(event));
                                    });
                                } else {
                                    tNextRoundStart_s = timestamp_s() + 0.001*tTimeBetweenRounds_ms;

                                    notifier.notify([&]() {
                                        std::this_thread::sleep_for(std::chrono::milliseconds(tTimeBetweenChecks_ms));

                                        Event event;
                                        event.roomId = id;
                                        event.type = Event::CheckStart;

                                        notifier.events->push(std::move(event));
                                    });
                                }
                            }
                            break;
                    };
                }
                break;
            case Event::EndRound:
                {
                    if (event.roomId != id) return;

                    switch (mode) {
                        case Standard:
                            {
                                //printf("Room %d: ending round %d\n", id, roundId);

                                Event event;
                                event.roomId = id;
                                event.type = Event::CheckStart;

                                notifier.events->push(std::move(event));
                            }
                            break;
                        case BattleRoyale:
                            {
                                printf("Room %d: ending BR round %d\n", id, roundId);

                                int nActive = 0;
                                for (auto & player : players) {
                                    if (player.active == 1) {
                                        ++nActive;
                                    }
                                }

                                if (nActive <= 2) {
                                    printf("Room %d: ending round\n", id);

                                    Event event;
                                    event.roomId = id;
                                    event.type = Event::CheckStart;

                                    notifier.events->push(std::move(event));
                                } else {
                                    int playerId = -1;
                                    float minScore = 1e6;
                                    for (int i = 0; i < (int) players.size(); ++i) {
                                        if (players[i].score < minScore && players[i].active == 1) {
                                            minScore = players[i].score;
                                            playerId = i;
                                        }
                                    }

                                    players[playerId].active = 2;

                                    tRoundLength_s += tBRRoundLength_s;

                                    notifier.notify([&]() {
                                        std::this_thread::sleep_for(std::chrono::milliseconds((uint64_t)(1000.0*tBRRoundLength_s)));

                                        Event event;
                                        event.roomId = id;
                                        event.type = Event::EndRound;

                                        notifier.events->push(std::move(event));
                                    });
                                }
                            }
                            break;
                    };
                }
                break;
            case Event::PlayerJoinRoom:
                {
                    if (event.roomId == id) {
                        for (auto & player : players) {
                            if (player.clientId == event.clientId) {
                                player.active = 1;
                                return;
                            }
                        }

                        PlayerInfo player;

                        switch (mode) {
                            case Standard:
                                {
                                    player.active = 1;
                                }
                                break;
                            case BattleRoyale:
                                {
                                    player.active = 2;
                                }
                                break;
                        };
                        player.clientId = event.clientId;

                        players.emplace_back(std::move(player));

                        printf("Client (%d) joined room '%s' (%d)\n", event.clientId, name.c_str(), id);
                    } else {
                        for (auto & player : players) {
                            if (player.clientId == event.clientId) {
                                player.active = 0;

                                printf("Client (%d) left room '%s' (%d)\n", event.clientId, name.c_str(), id);
                            }
                        }
                    }
                }
                break;
            case Event::PlayerInput:
                {
                    if (event.roomId != id) return;
                    if (::timestamp_s() > tRoundStart_s + tRoundLength_s) return;

                    int playerId = -1;
                    for (int i = 0; i < (int) players.size(); ++i) {
                        if (players[i].clientId == event.clientId) {
                            playerId = i;
                            break;
                        }
                    }

                    if (playerId == -1) return;
                    if (players[playerId].active != 1) return;

                    printf("Room %d: client %d submitted '%s'\n", id, event.clientId, event.inputStr.data());

                    auto & player = players[playerId];

                    bool correct = false;
                    for (auto & query : pool) {
                        if (event.inputStr == query.answer) {
                            player.score += 3.0f + 0.2f*query.answer.size();
                            correct = true;
                            query.clientId = event.clientId;
                            query.tGuessed_s = ::timestamp_s();
                            poolOld.emplace_back(std::move(query));
                            query = generate();
                            printf("correct!\n");

                            break;
                        }
                    }

                    if (correct == false) {
                        printf("wrong!\n");
                        player.score -= 1.0f;
                        if (player.score < 0.0) player.score = 0.0f;
                    }
                }
                break;
            default:
                {
                    printf("Unhandled event, type = %d\n", event.type);
                }
                break;
        };
    }